

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createHairyPlane
          (SceneGraph *this,int hash,Vec3fa *pos,Vec3fa *dx,Vec3fa *dy,float len,float r,
          size_t numHairs,CurveSubtype subtype,Ref<embree::SceneGraph::MaterialNode> material)

{
  ulong uVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  pointer pvVar4;
  Vec3fx *pVVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  uint uVar10;
  HairSetNode *this_00;
  Vec3fx *pVVar11;
  long lVar12;
  size_t sVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar24;
  undefined1 auVar22 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  Ref<embree::SceneGraph::MaterialNode> local_d0;
  float local_c4;
  Hair local_c0;
  Vec3fa *local_b8;
  Vec3fa *local_b0;
  Vec3fa *local_a8;
  size_t local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  Node *local_80;
  vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
  *local_78;
  size_t local_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  local_b8 = dx;
  local_b0 = pos;
  local_a8 = dy;
  local_a0 = numHairs;
  this_00 = (HairSetNode *)::operator_new(0x118);
  local_d0.ptr = (MaterialNode *)((material.ptr)->super_Node).super_RefCount._vptr_RefCount;
  if (local_d0.ptr != (MaterialNode *)0x0) {
    (*((local_d0.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  HairSetNode::HairSetNode
            (this_00,RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE - (subtype == ROUND_CURVE),&local_d0,
             (BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_d0.ptr != (MaterialNode *)0x0) {
    (*((local_d0.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  if (local_a0 == 1) {
    uVar7 = *(undefined8 *)&local_b0->field_0;
    uVar8 = *(undefined8 *)((long)&local_b0->field_0 + 8);
    local_c0.vertex = 0;
    local_c0.id = 0;
    std::
    vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
    ::emplace_back<embree::SceneGraph::HairSetNode::Hair>(&this_00->hairs,&local_c0);
    pvVar4 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar13 = pvVar4->size_active;
    uVar14 = pvVar4->size_alloced;
    uVar1 = sVar13 + 1;
    local_f8 = (float)uVar7;
    fStack_f4 = (float)((ulong)uVar7 >> 0x20);
    fStack_f0 = (float)uVar8;
    if (uVar14 < uVar1) {
      uVar15 = uVar14;
      uVar16 = uVar1;
      if (uVar14 != 0) {
        for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
        }
      }
      if (uVar14 != uVar16) {
        pVVar5 = pvVar4->items;
        pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
        pvVar4->items = pVVar11;
        lVar12 = 0;
        for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
          puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          lVar12 = lVar12 + 0x10;
        }
        alignedFree(pVVar5);
        pvVar4->size_active = sVar13;
        pvVar4->size_alloced = uVar16;
      }
    }
    pvVar4->size_active = uVar1;
    pVVar5 = pvVar4->items + sVar13;
    (pVVar5->field_0).m128[0] = local_f8;
    (pVVar5->field_0).m128[1] = fStack_f4;
    (pVVar5->field_0).m128[2] = fStack_f0;
    (pVVar5->field_0).m128[3] = r;
    pvVar4 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar13 = pvVar4->size_active;
    uVar14 = pvVar4->size_alloced;
    uVar1 = sVar13 + 1;
    if (uVar14 < uVar1) {
      uVar15 = uVar14;
      uVar16 = uVar1;
      if (uVar14 != 0) {
        for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
        }
      }
      if (uVar14 != uVar16) {
        pVVar5 = pvVar4->items;
        pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
        pvVar4->items = pVVar11;
        lVar12 = 0;
        for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
          puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          lVar12 = lVar12 + 0x10;
        }
        alignedFree(pVVar5);
        pvVar4->size_active = sVar13;
        pvVar4->size_alloced = uVar16;
      }
    }
    pvVar4->size_active = uVar1;
    pVVar5 = pvVar4->items + sVar13;
    (pVVar5->field_0).m128[0] = len * 1.0 + local_f8;
    (pVVar5->field_0).m128[1] = len * 0.0 + fStack_f4;
    (pVVar5->field_0).m128[2] = len * 0.0 + fStack_f0;
    (pVVar5->field_0).m128[3] = r;
    pvVar4 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar13 = pvVar4->size_active;
    uVar14 = pvVar4->size_alloced;
    uVar1 = sVar13 + 1;
    if (uVar14 < uVar1) {
      uVar15 = uVar14;
      uVar16 = uVar1;
      if (uVar14 != 0) {
        for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
        }
      }
      if (uVar14 != uVar16) {
        pVVar5 = pvVar4->items;
        pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
        pvVar4->items = pVVar11;
        lVar12 = 0;
        for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
          puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          lVar12 = lVar12 + 0x10;
        }
        alignedFree(pVVar5);
        pvVar4->size_active = sVar13;
        pvVar4->size_alloced = uVar16;
      }
    }
    pvVar4->size_active = uVar1;
    pVVar5 = pvVar4->items + sVar13;
    (pVVar5->field_0).m128[0] = len * 0.0 + local_f8;
    (pVVar5->field_0).m128[1] = len * 1.0 + fStack_f4;
    (pVVar5->field_0).m128[2] = len * 1.0 + fStack_f0;
    (pVVar5->field_0).m128[3] = r;
    pvVar4 = (this_00->positions).
             super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar13 = pvVar4->size_active;
    uVar14 = pvVar4->size_alloced;
    uVar1 = sVar13 + 1;
    if (uVar14 < uVar1) {
      uVar15 = uVar14;
      uVar16 = uVar1;
      if (uVar14 != 0) {
        for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
        }
      }
      if (uVar14 != uVar16) {
        pVVar5 = pvVar4->items;
        pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
        pvVar4->items = pVVar11;
        lVar12 = 0;
        for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
          puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
          uVar7 = puVar2[1];
          puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
          *puVar3 = *puVar2;
          puVar3[1] = uVar7;
          lVar12 = lVar12 + 0x10;
        }
        alignedFree(pVVar5);
        pvVar4->size_active = sVar13;
        pvVar4->size_alloced = uVar16;
      }
    }
    pvVar4->size_active = uVar1;
    pVVar5 = pvVar4->items + sVar13;
    (pVVar5->field_0).m128[0] = len * 0.0 + local_f8;
    (pVVar5->field_0).m128[1] = len * 1.0 + fStack_f4;
    (pVVar5->field_0).m128[2] = len * 0.0 + fStack_f0;
    (pVVar5->field_0).m128[3] = r;
    *(HairSetNode **)this = this_00;
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  }
  else {
    uVar10 = (uint)(hash * -0x3361d2af) >> 0x11 | hash * 0x16a88000;
    uVar10 = (uVar10 * -0x194da000 | uVar10 * 0x1b873593 >> 0x13) * 5 + 0xe6546b64;
    uVar10 = (uVar10 >> 0x10 ^ uVar10) * -0x7a143595;
    uVar10 = (uVar10 >> 0xd ^ uVar10) * -0x3d4d51cb;
    uVar10 = uVar10 >> 0x10 ^ uVar10;
    fStack_50 = (local_a8->field_0).m128[1] * (local_b8->field_0).m128[0] -
                (local_b8->field_0).m128[1] * (local_a8->field_0).m128[0];
    local_58 = (local_a8->field_0).m128[2] * (local_b8->field_0).m128[1] -
               (local_b8->field_0).m128[2] * (local_a8->field_0).m128[1];
    fStack_54 = (local_a8->field_0).m128[0] * (local_b8->field_0).m128[2] -
                (local_b8->field_0).m128[0] * (local_a8->field_0).m128[2];
    fStack_4c = (local_a8->field_0).m128[3] * (local_b8->field_0).m128[3] -
                (local_b8->field_0).m128[3] * (local_a8->field_0).m128[3];
    fVar26 = local_58 * local_58;
    fStack_60 = fStack_54 * fStack_54;
    fStack_5c = fStack_4c * fStack_4c;
    local_68 = fStack_60 + fVar26 + fStack_50 * fStack_50;
    fStack_64 = fStack_5c + fVar26 + fVar26;
    fStack_60 = fStack_60 + fVar26 + fStack_60;
    fStack_5c = fStack_5c + fVar26 + fStack_5c;
    local_c4 = local_68 * 0.5;
    local_78 = &this_00->hairs;
    sVar13 = 0;
    local_80 = (Node *)this;
    while (this = (SceneGraph *)local_80, sVar13 != local_a0) {
      fVar17 = (float)(uVar10 * 0x19660d + 0x3c6ef35f >> 1) * 4.656613e-10;
      local_48 = (local_b8->field_0).m128[0];
      fStack_44 = (local_b8->field_0).m128[1];
      fStack_40 = (local_b8->field_0).m128[2];
      fStack_3c = (local_b8->field_0).m128[3];
      fVar18 = fVar17 * local_48;
      fVar23 = fVar17 * fStack_44;
      fVar17 = fVar17 * fStack_40;
      fVar26 = (local_b0->field_0).m128[0];
      fVar29 = (local_b0->field_0).m128[1];
      fVar30 = (local_b0->field_0).m128[2];
      local_98 = *(undefined8 *)&local_a8->field_0;
      uStack_90 = *(undefined8 *)((long)&local_a8->field_0 + 8);
      local_c0.id = (uint)sVar13;
      local_c0.vertex = (uint)sVar13 * 4;
      local_70 = sVar13;
      std::
      vector<embree::SceneGraph::HairSetNode::Hair,_std::allocator<embree::SceneGraph::HairSetNode::Hair>_>
      ::emplace_back<embree::SceneGraph::HairSetNode::Hair>(local_78,&local_c0);
      pvVar4 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar13 = pvVar4->size_active;
      uVar14 = pvVar4->size_alloced;
      uVar1 = sVar13 + 1;
      if (uVar14 < uVar1) {
        uVar15 = uVar14;
        uVar16 = uVar1;
        if (uVar14 != 0) {
          for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
          }
        }
        if (uVar14 != uVar16) {
          pVVar5 = pvVar4->items;
          pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
          pvVar4->items = pVVar11;
          lVar12 = 0;
          for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
            puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            lVar12 = lVar12 + 0x10;
          }
          alignedFree(pVVar5);
          pvVar4->size_active = sVar13;
          pvVar4->size_alloced = uVar16;
        }
      }
      uVar10 = uVar10 * 0x17385ca9 + 0x47502932;
      fVar19 = (float)(uVar10 >> 1) * 4.656613e-10;
      fVar26 = fVar18 + fVar26 + fVar19 * (float)local_98;
      fVar29 = fVar23 + fVar29 + fVar19 * local_98._4_4_;
      fVar30 = fVar17 + fVar30 + fVar19 * (float)uStack_90;
      pvVar4->size_active = uVar1;
      pVVar5 = pvVar4->items + sVar13;
      (pVVar5->field_0).m128[0] = fVar26;
      (pVVar5->field_0).m128[1] = fVar29;
      (pVVar5->field_0).m128[2] = fVar30;
      (pVVar5->field_0).m128[3] = r;
      pvVar4 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar13 = pvVar4->size_active;
      uVar14 = pvVar4->size_alloced;
      uVar1 = sVar13 + 1;
      if (uVar14 < uVar1) {
        uVar15 = uVar14;
        uVar16 = uVar1;
        if (uVar14 != 0) {
          for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
          }
        }
        if (uVar14 != uVar16) {
          pVVar5 = pvVar4->items;
          pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
          pvVar4->items = pVVar11;
          lVar12 = 0;
          for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
            puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            lVar12 = lVar12 + 0x10;
          }
          alignedFree(pVVar5);
          pvVar4->size_active = sVar13;
          pvVar4->size_alloced = uVar16;
        }
      }
      fVar17 = fStack_44 * fStack_44;
      fVar18 = fStack_40 * fStack_40;
      fVar23 = fStack_3c * fStack_3c;
      fVar19 = fVar17 + local_48 * local_48 + fVar18;
      fVar27 = fVar17 + fVar17 + fVar23;
      fVar18 = fVar17 + fVar18 + fVar18;
      fVar23 = fVar17 + fVar23 + fVar23;
      auVar20._4_4_ = fVar27;
      auVar20._0_4_ = fVar19;
      auVar20._8_4_ = fVar18;
      auVar20._12_4_ = fVar23;
      auVar21._4_4_ = fVar27;
      auVar21._0_4_ = fVar19;
      auVar21._8_4_ = fVar18;
      auVar21._12_4_ = fVar23;
      auVar21 = rsqrtss(auVar20,auVar21);
      fVar17 = auVar21._0_4_;
      fVar17 = fVar17 * 1.5 - fVar17 * fVar17 * fVar19 * 0.5 * fVar17;
      pvVar4->size_active = uVar1;
      pVVar5 = pvVar4->items + sVar13;
      (pVVar5->field_0).m128[0] = fVar17 * local_48 * len + fVar26;
      (pVVar5->field_0).m128[1] = fVar17 * fStack_44 * len + fVar29;
      (pVVar5->field_0).m128[2] = fVar17 * fStack_40 * len + fVar30;
      (pVVar5->field_0).m128[3] = r;
      pvVar4 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar13 = pvVar4->size_active;
      uVar14 = pvVar4->size_alloced;
      uVar1 = sVar13 + 1;
      if (uVar14 < uVar1) {
        uVar15 = uVar14;
        uVar16 = uVar1;
        if (uVar14 != 0) {
          for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
          }
        }
        if (uVar14 != uVar16) {
          pVVar5 = pvVar4->items;
          pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
          pvVar4->items = pVVar11;
          lVar12 = 0;
          for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
            puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            lVar12 = lVar12 + 0x10;
          }
          alignedFree(pVVar5);
          pvVar4->size_active = sVar13;
          pvVar4->size_alloced = uVar16;
        }
      }
      auVar9._4_4_ = fStack_64;
      auVar9._0_4_ = local_68;
      auVar9._8_4_ = fStack_60;
      auVar9._12_4_ = fStack_5c;
      auVar21 = rsqrtss(auVar9,auVar9);
      fVar17 = auVar21._0_4_;
      fVar31 = fVar17 * 1.5 - fVar17 * fVar17 * local_c4 * fVar17;
      fVar17 = fVar31 * local_58;
      fVar18 = fVar31 * fStack_54;
      fVar23 = fVar31 * fStack_50;
      fVar19 = local_98._4_4_ * local_98._4_4_;
      fVar27 = (float)uStack_90 * (float)uStack_90;
      fVar24 = uStack_90._4_4_ * uStack_90._4_4_;
      fVar25 = fVar19 + (float)local_98 * (float)local_98 + fVar27;
      fVar28 = fVar19 + fVar19 + fVar24;
      fVar27 = fVar19 + fVar27 + fVar27;
      fVar24 = fVar19 + fVar24 + fVar24;
      auVar22._4_4_ = fVar28;
      auVar22._0_4_ = fVar25;
      auVar22._8_4_ = fVar27;
      auVar22._12_4_ = fVar24;
      auVar6._4_4_ = fVar28;
      auVar6._0_4_ = fVar25;
      auVar6._8_4_ = fVar27;
      auVar6._12_4_ = fVar24;
      auVar21 = rsqrtss(auVar22,auVar6);
      fVar19 = auVar21._0_4_;
      fVar19 = fVar19 * 1.5 - fVar19 * fVar19 * fVar25 * 0.5 * fVar19;
      pvVar4->size_active = uVar1;
      pVVar5 = pvVar4->items + sVar13;
      (pVVar5->field_0).m128[0] = (fVar19 * (float)local_98 + fVar17) * len + fVar26;
      (pVVar5->field_0).m128[1] = (fVar19 * local_98._4_4_ + fVar18) * len + fVar29;
      (pVVar5->field_0).m128[2] = (fVar19 * (float)uStack_90 + fVar23) * len + fVar30;
      (pVVar5->field_0).m128[3] = r;
      pvVar4 = (this_00->positions).
               super__Vector_base<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fx,_embree::aligned_allocator<embree::Vec3fx,_16UL>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      sVar13 = pvVar4->size_active;
      uVar14 = pvVar4->size_alloced;
      uVar1 = sVar13 + 1;
      if (uVar14 < uVar1) {
        uVar15 = uVar14;
        uVar16 = uVar1;
        if (uVar14 != 0) {
          for (; uVar16 = uVar15, uVar15 < uVar1; uVar15 = uVar15 * 2 + (ulong)(uVar15 * 2 == 0)) {
          }
        }
        if (uVar14 != uVar16) {
          local_98 = CONCAT44(fVar18,fVar17);
          uStack_90 = CONCAT44(fVar31 * fStack_4c,fVar23);
          pVVar5 = pvVar4->items;
          pVVar11 = (Vec3fx *)alignedMalloc(uVar16 << 4,0x10);
          pvVar4->items = pVVar11;
          lVar12 = 0;
          for (uVar14 = 0; uVar14 < pvVar4->size_active; uVar14 = uVar14 + 1) {
            puVar2 = (undefined8 *)((long)&pVVar5->field_0 + lVar12);
            uVar7 = puVar2[1];
            puVar3 = (undefined8 *)((long)&pvVar4->items->field_0 + lVar12);
            *puVar3 = *puVar2;
            puVar3[1] = uVar7;
            lVar12 = lVar12 + 0x10;
          }
          alignedFree(pVVar5);
          pvVar4->size_active = sVar13;
          pvVar4->size_alloced = uVar16;
          fVar17 = (float)local_98;
          fVar18 = local_98._4_4_;
          fVar23 = (float)uStack_90;
        }
      }
      pvVar4->size_active = uVar1;
      pVVar5 = pvVar4->items + sVar13;
      (pVVar5->field_0).m128[0] = fVar26 + fVar17 * len;
      (pVVar5->field_0).m128[1] = fVar29 + fVar18 * len;
      (pVVar5->field_0).m128[2] = fVar30 + fVar23 * len;
      (pVVar5->field_0).m128[3] = r;
      sVar13 = local_70 + 1;
    }
    (local_80->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
    (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  }
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createHairyPlane (int hash, const Vec3fa& pos, const Vec3fa& dx, const Vec3fa& dy, const float len, const float r, size_t numHairs, CurveSubtype subtype, Ref<MaterialNode> material)
  {
    RandomSampler sampler;
    RandomSampler_init(sampler,hash);

    RTCGeometryType type = (subtype == ROUND_CURVE) ? RTC_GEOMETRY_TYPE_ROUND_BEZIER_CURVE : RTC_GEOMETRY_TYPE_FLAT_BEZIER_CURVE;
    Ref<SceneGraph::HairSetNode> mesh = new SceneGraph::HairSetNode(type,material,BBox1f(0,1),1);

    if (numHairs == 1) {
      const Vec3fa p0 = pos;
      const Vec3fa p1 = p0 + len*Vec3fa(1,0,0);
      const Vec3fa p2 = p0 + len*Vec3fa(0,1,1);
      const Vec3fa p3 = p0 + len*Vec3fa(0,1,0);
      mesh->hairs.push_back(HairSetNode::Hair(0,0));
      mesh->positions[0].push_back(Vec3ff(p0,r));
      mesh->positions[0].push_back(Vec3ff(p1,r));
      mesh->positions[0].push_back(Vec3ff(p2,r));
      mesh->positions[0].push_back(Vec3ff(p3,r));
      return mesh.dynamicCast<SceneGraph::Node>();
    }

    Vec3fa dz = cross(dx,dy);
    for (size_t i=0; i<numHairs; i++) 
    {
      const Vec3fa p0 = pos + RandomSampler_getFloat(sampler)*dx + RandomSampler_getFloat(sampler)*dy;
      const Vec3fa p1 = p0 + len*normalize(dx);
      const Vec3fa p2 = p0 + len*(normalize(dz)+normalize(dy));
      const Vec3fa p3 = p0 + len*normalize(dz);
      mesh->hairs.push_back(HairSetNode::Hair(unsigned(4*i),unsigned(i)));
      mesh->positions[0].push_back(Vec3ff(p0,r));
      mesh->positions[0].push_back(Vec3ff(p1,r));
      mesh->positions[0].push_back(Vec3ff(p2,r));
      mesh->positions[0].push_back(Vec3ff(p3,r));
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }